

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

uint __thiscall UnionType::indexOfType(UnionType *this,Type *type)

{
  pointer ppVar1;
  uint uVar2;
  raw_ostream *prVar3;
  string sStack_38;
  
  ppVar1 = (this->super_AggregateType).items.
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  while( true ) {
    if ((ulong)(((long)(this->super_AggregateType).items.
                       super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x28) <=
        (ulong)uVar2) {
      prVar3 = (raw_ostream *)llvm::errs();
      (*type->_vptr_Type[3])(&sStack_38,type);
      prVar3 = llvm::raw_ostream::operator<<(prVar3,&sStack_38);
      llvm::raw_ostream::operator<<(prVar3,"\n");
      std::__cxx11::string::~string((string *)&sStack_38);
      abort();
    }
    if (ppVar1[uVar2].first == type) break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

unsigned UnionType::indexOfType(Type* type) const {
    for (unsigned i = 0; i < items.size(); ++i) {
        if (items[i].first == type) {
            return i;
        }
    }

    llvm::errs() << type->toString() << "\n";
    assert(false && "UnionType::indexOfType: type not found in the union");
    abort();
}